

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

bool __thiscall
cmInstallCommand::HandleExportMode
          (cmInstallCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCommandArgumentGroup *group;
  pointer pbVar1;
  cmTargetExport *name;
  char *destination;
  char *file_permissions;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  MessageLevel message;
  ostream *poVar5;
  string *psVar6;
  long lVar7;
  cmGlobalGenerator *pcVar8;
  cmTarget *pcVar9;
  cmInstallExportGenerator *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  pointer ppcVar10;
  string fname;
  string local_7d0;
  cmExportSet *local_7b0;
  string local_7a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unknownArgs;
  ostringstream e;
  ios_base local_6f0 [264];
  cmCAString exp;
  cmCAString filename;
  cmCAEnabler exportOld;
  cmCAString name_space;
  cmInstallCommandArguments ica;
  
  cmInstallCommandArguments::cmInstallCommandArguments(&ica,&this->DefaultComponentName);
  cmCAString::cmCAString(&exp,&ica.Parser,"EXPORT",(cmCommandArgumentGroup *)0x0);
  group = &ica.ArgumentGroup;
  cmCAString::cmCAString(&name_space,&ica.Parser,"NAMESPACE",group);
  cmCAEnabler::cmCAEnabler(&exportOld,&ica.Parser,"EXPORT_LINK_INTERFACE_LIBRARIES",group);
  cmCAString::cmCAString(&filename,&ica.Parser,"FILE",group);
  cmCommandArgument::Follows(&exp.super_cmCommandArgument,(cmCommandArgument *)0x0);
  cmCommandArgumentGroup::Follows(group,&exp.super_cmCommandArgument);
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unknownArgs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmCommandArgumentsHelper::Parse(&ica.Parser,args,&unknownArgs);
  if (unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      unknownArgs.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = cmInstallCommandArguments::Finalize(&ica);
    if (bVar2) {
      psVar6 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
      if (psVar6->_M_string_length == 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," given no DESTINATION!",0x16);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&fname);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)fname._M_dataplus._M_p != &fname.field_2) {
          operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
        }
        goto LAB_002ba19e;
      }
      fname._M_dataplus._M_p = (pointer)&fname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fname,filename.String._M_dataplus._M_p,
                 filename.String._M_dataplus._M_p + filename.String._M_string_length);
      lVar7 = std::__cxx11::string::find_first_of((char *)&fname,0x4cb5b1,0);
      if (lVar7 == -1) {
        if (fname._M_string_length == 0) {
          bVar2 = false;
        }
        else {
          cmsys::SystemTools::GetFilenameLastExtension(&local_7a8,&fname);
          iVar3 = std::__cxx11::string::compare((char *)&local_7a8);
          bVar2 = iVar3 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
            operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
          pbVar1 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5," given invalid export file name \"",0x21);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,fname._M_dataplus._M_p,fname._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".  ",4);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar5,"The FILE argument must specify a name ending in \".cmake\".",0x39);
          std::__cxx11::stringbuf::str();
          cmCommand::SetError(&this->super_cmCommand,&local_7d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
            operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
          }
          goto LAB_002ba57c;
        }
        if (fname._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&fname);
          std::__cxx11::string::append((char *)&fname);
          lVar7 = std::__cxx11::string::find_first_of((char *)&fname,0x4cb5b1,0);
          if (lVar7 != -1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
            pbVar1 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5," given export name \"",0x14);
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,exp.String._M_dataplus._M_p,exp.String._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".  ",4);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"This name cannot be safely converted to a file name.  ",0x36);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"Specify a different export name or use the FILE option to set ",0x3e)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar5,"a file name explicitly.",0x17);
            std::__cxx11::stringbuf::str();
            cmCommand::SetError(&this->super_cmCommand,&local_7d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
              operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_002ba57c;
          }
        }
        pcVar8 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
        local_7b0 = cmExportSetMap::operator[](&pcVar8->ExportSets,&exp.String);
        if ((exportOld.Enabled == true) &&
           (ppcVar10 = (local_7b0->TargetExports).
                       super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>.
                       _M_impl.super__Vector_impl_data._M_start,
           ppcVar10 !=
           (local_7b0->TargetExports).
           super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
           super__Vector_impl_data._M_finish)) {
          do {
            name = *ppcVar10;
            pcVar8 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
            pcVar9 = cmGlobalGenerator::FindTarget(pcVar8,&name->TargetName,false);
            if (pcVar9 == (cmTarget *)0x0) {
LAB_002ba656:
              bVar2 = false;
            }
            else {
              PVar4 = cmPolicies::PolicyMap::Get(&pcVar9->PolicyMap,CMP0022);
              if (PVar4 == WARN) goto LAB_002ba656;
              PVar4 = cmPolicies::PolicyMap::Get(&pcVar9->PolicyMap,CMP0022);
              bVar2 = PVar4 != OLD;
            }
            if (!bVar2) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"INSTALL(EXPORT) given keyword \"",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"EXPORT_LINK_INTERFACE_LIBRARIES",0x1f);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&e,"\", but target \"",0xf);
              poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)&e,(name->TargetName)._M_dataplus._M_p,
                                  (name->TargetName)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar5,"\" does not have policy CMP0022 set to NEW.",0x2a);
              std::__cxx11::stringbuf::str();
              cmCommand::SetError(&this->super_cmCommand,&local_7d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
                operator_delete(local_7d0._M_dataplus._M_p,
                                local_7d0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
              std::ios_base::~ios_base(local_6f0);
              goto LAB_002ba59d;
            }
            ppcVar10 = ppcVar10 + 1;
          } while (ppcVar10 !=
                   (local_7b0->TargetExports).
                   super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        message = cmInstallGenerator::SelectMessageLevel((this->super_cmCommand).Makefile,false);
        this_00 = (cmInstallExportGenerator *)operator_new(0x178);
        psVar6 = cmInstallCommandArguments::GetDestination_abi_cxx11_(&ica);
        destination = (psVar6->_M_dataplus)._M_p;
        psVar6 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(&ica);
        file_permissions = (psVar6->_M_dataplus)._M_p;
        configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(&ica);
        psVar6 = cmInstallCommandArguments::GetComponent_abi_cxx11_(&ica);
        cmInstallExportGenerator::cmInstallExportGenerator
                  (this_00,local_7b0,destination,file_permissions,configurations,
                   (psVar6->_M_dataplus)._M_p,message,fname._M_dataplus._M_p,
                   name_space.String._M_dataplus._M_p,exportOld.Enabled);
        bVar2 = true;
        cmMakefile::AddInstallGenerator
                  ((this->super_cmCommand).Makefile,(cmInstallGenerator *)this_00);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        pbVar1 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5," given invalid export file name \"",0x21);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,fname._M_dataplus._M_p,fname._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".  ",4);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"The FILE argument may not contain a path.  ",0x2b);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,"Specify the path in the DESTINATION argument.",0x2d);
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(&this->super_cmCommand,&local_7a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
          operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
        }
LAB_002ba57c:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
        std::ios_base::~ios_base(local_6f0);
LAB_002ba59d:
        bVar2 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fname._M_dataplus._M_p != &fname.field_2) {
        operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
      }
      goto LAB_002ba306;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&e,(pbVar1->_M_dataplus)._M_p,pbVar1->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," given unknown argument \"",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,((unknownArgs.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,
                        (unknownArgs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&fname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fname._M_dataplus._M_p != &fname.field_2) {
      operator_delete(fname._M_dataplus._M_p,fname.field_2._M_allocated_capacity + 1);
    }
LAB_002ba19e:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    std::ios_base::~ios_base(local_6f0);
  }
  bVar2 = false;
LAB_002ba306:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unknownArgs);
  filename.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005c5540
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)filename.String._M_dataplus._M_p != &filename.String.field_2) {
    operator_delete(filename.String._M_dataplus._M_p,
                    filename.String.field_2._M_allocated_capacity + 1);
  }
  filename.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005c54e0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&filename.super_cmCommandArgument.ArgumentsBefore._M_t);
  exportOld.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005c54e0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exportOld.super_cmCommandArgument.ArgumentsBefore._M_t);
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCAString_005c5540;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name_space.String._M_dataplus._M_p != &name_space.String.field_2) {
    operator_delete(name_space.String._M_dataplus._M_p,
                    name_space.String.field_2._M_allocated_capacity + 1);
  }
  name_space.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005c54e0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&name_space.super_cmCommandArgument.ArgumentsBefore._M_t);
  exp.super_cmCommandArgument._vptr_cmCommandArgument = (_func_int **)&PTR__cmCAString_005c5540;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)exp.String._M_dataplus._M_p != &exp.String.field_2) {
    operator_delete(exp.String._M_dataplus._M_p,exp.String.field_2._M_allocated_capacity + 1);
  }
  exp.super_cmCommandArgument._vptr_cmCommandArgument =
       (_func_int **)&PTR__cmCommandArgument_005c54e0;
  std::
  _Rb_tree<const_cmCommandArgument_*,_const_cmCommandArgument_*,_std::_Identity<const_cmCommandArgument_*>,_std::less<const_cmCommandArgument_*>,_std::allocator<const_cmCommandArgument_*>_>
  ::~_Rb_tree(&exp.super_cmCommandArgument.ArgumentsBefore._M_t);
  cmInstallCommandArguments::~cmInstallCommandArguments(&ica);
  return bVar2;
}

Assistant:

bool cmInstallCommand::HandleExportMode(std::vector<std::string> const& args)
{
  // This is the EXPORT mode.
  cmInstallCommandArguments ica(this->DefaultComponentName);
  cmCAString exp(&ica.Parser, "EXPORT");
  cmCAString name_space(&ica.Parser, "NAMESPACE", &ica.ArgumentGroup);
  cmCAEnabler exportOld(&ica.Parser, "EXPORT_LINK_INTERFACE_LIBRARIES",
                        &ica.ArgumentGroup);
  cmCAString filename(&ica.Parser, "FILE", &ica.ArgumentGroup);
  exp.Follows(0);

  ica.ArgumentGroup.Follows(&exp);
  std::vector<std::string> unknownArgs;
  ica.Parse(&args, &unknownArgs);

  if (!unknownArgs.empty())
    {
    // Unknown argument.
    std::ostringstream e;
    e << args[0] << " given unknown argument \"" << unknownArgs[0] << "\".";
    this->SetError(e.str());
    return false;
    }

  if (!ica.Finalize())
    {
    return false;
    }

  // Make sure there is a destination.
  if(ica.GetDestination().empty())
    {
    // A destination is required.
    std::ostringstream e;
    e << args[0] << " given no DESTINATION!";
    this->SetError(e.str());
    return false;
    }

  // Check the file name.
  std::string fname = filename.GetString();
  if(fname.find_first_of(":/\\") != fname.npos)
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument may not contain a path.  "
      << "Specify the path in the DESTINATION argument.";
    this->SetError(e.str());
    return false;
    }

  // Check the file extension.
  if(!fname.empty() &&
     cmSystemTools::GetFilenameLastExtension(fname) != ".cmake")
    {
    std::ostringstream e;
    e << args[0] << " given invalid export file name \"" << fname << "\".  "
      << "The FILE argument must specify a name ending in \".cmake\".";
    this->SetError(e.str());
    return false;
    }

  // Construct the file name.
  if(fname.empty())
    {
    fname = exp.GetString();
    fname += ".cmake";

    if(fname.find_first_of(":/\\") != fname.npos)
      {
      std::ostringstream e;
      e << args[0] << " given export name \"" << exp.GetString() << "\".  "
        << "This name cannot be safely converted to a file name.  "
        << "Specify a different export name or use the FILE option to set "
        << "a file name explicitly.";
      this->SetError(e.str());
      return false;
      }
    }

  cmExportSet *exportSet = this->Makefile->GetGlobalGenerator()
                                         ->GetExportSets()[exp.GetString()];
  if (exportOld.IsEnabled())
    {
    for(std::vector<cmTargetExport*>::const_iterator
          tei = exportSet->GetTargetExports()->begin();
        tei != exportSet->GetTargetExports()->end(); ++tei)
      {
      cmTargetExport const* te = *tei;
      cmTarget* tgt =
        this->Makefile->GetGlobalGenerator()->FindTarget(te->TargetName);
      const bool newCMP0022Behavior =
        (tgt &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
         tgt->GetPolicyStatusCMP0022() != cmPolicies::OLD);

      if(!newCMP0022Behavior)
        {
        std::ostringstream e;
        e << "INSTALL(EXPORT) given keyword \""
          << "EXPORT_LINK_INTERFACE_LIBRARIES" << "\", but target \""
          << te->TargetName
          << "\" does not have policy CMP0022 set to NEW.";
        this->SetError(e.str());
        return false;
        }
      }
    }

  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(this->Makefile);

  // Create the export install generator.
  cmInstallExportGenerator* exportGenerator =
    new cmInstallExportGenerator(
      exportSet,
      ica.GetDestination().c_str(),
      ica.GetPermissions().c_str(), ica.GetConfigurations(),
      ica.GetComponent().c_str(), message, fname.c_str(),
      name_space.GetCString(), exportOld.IsEnabled());
  this->Makefile->AddInstallGenerator(exportGenerator);

  return true;
}